

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

bool __thiscall slang::SourceManager::isFileLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  bool bVar2;
  ulong uVar3;
  
  if ((location._0_4_ & 0xfffffff) == 0xfffffff) {
    return false;
  }
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if (((ulong)location & 0xfffffff) != 0) {
    uVar3 = (ulong)(location._0_4_ & 0xfffffff);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < (ulong)((long)(this->bufferEntries).
                              super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 6)) {
      bVar2 = pvVar1 != (pointer)0x0 &&
              *(__index_type *)
               ((long)&pvVar1[uVar3].
                       super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               + 0x38) == '\0';
      goto LAB_003113b4;
    }
  }
  bVar2 = false;
LAB_003113b4:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return bVar2;
}

Assistant:

bool SourceManager::isFileLoc(SourceLocation location) const {
    if (location.buffer() == SourceLocation::NoLocation.buffer())
        return false;

    std::shared_lock<std::shared_mutex> lock(mutex);
    return getFileInfo(location.buffer(), lock) != nullptr;
}